

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  test_fixture *this;
  pointer psVar1;
  bool bVar2;
  bool bVar3;
  shared_ptr<test_fixture> *tf;
  pointer psVar4;
  string fixture_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::set_terminate(handle_terminate);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&local_50);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&local_70);
  }
  psVar1 = _test_fixtures.
           super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  psVar4 = _test_fixtures.
           super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar4 == psVar1) {
      if (bVar3) {
        puts("\nFailure.");
        system("/bin/bash -c \'read -p \"Press Any Key\"\'");
      }
      else {
        puts("\nSuccess.");
      }
      std::__cxx11::string::~string((string *)&local_70);
      return 0;
    }
    if (local_70._M_string_length == 0) {
LAB_00103966:
      test_fixture::run_tests
                ((psVar4->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      this = (psVar4->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this->_something_failed == true) {
        bVar3 = true;
        test_fixture::print_failures(this);
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &((psVar4->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  _fixture_name);
      bVar2 = std::operator!=(&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar2) goto LAB_00103966;
    }
    psVar4 = psVar4 + 1;
  } while( true );
}

Assistant:

int main( int argc, char* argv[] )
{
    set_terminate( handle_terminate );

    std::string fixture_name = "";

    if( argc > 1 )
        fixture_name = argv[1];

#ifdef IS_WINDOWS
    srand( (unsigned int)GetSystemTimeAsUnixTime() );
#endif
#ifdef IS_LINUX
    srand( time(0) );
#endif

    bool something_failed = false;

    for(auto& tf : _test_fixtures)
    {
        if( !fixture_name.empty() )
            if(tf->get_name() != fixture_name )
                continue;

        tf->run_tests();

        if( tf->something_failed() )
        {
            something_failed = true;
            tf->print_failures();
        }
    }

    if( !something_failed )
        printf("\nSuccess.\n");
    else printf("\nFailure.\n");

    if(something_failed)
        system("/bin/bash -c 'read -p \"Press Any Key\"'");

    return 0;
}